

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::Opnd::IsWriteBarrierTriggerableValue(Opnd *this)

{
  bool bVar1;
  IRType IVar2;
  AddrOpndKind AVar3;
  AddrOpnd *this_00;
  bool local_29;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  Opnd *local_18;
  Opnd *this_local;
  
  local_18 = this;
  bVar1 = IsTaggedValue(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    IVar2 = GetType(this);
    if (TySize[IVar2] == 8) {
      if (((DAT_01eca37e & 1) == 0) || ((DAT_01eca37f & 1) == 0)) {
        bVar1 = IsAddrOpnd(this);
        if (bVar1) {
          this_00 = AsAddrOpnd(this);
          AVar3 = AddrOpnd::GetAddrOpndKind(this_00);
          if (AVar3 == AddrOpndKindDynamicVar) {
            return false;
          }
        }
        local_1a.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             GetValueType(this);
        bVar1 = ValueType::IsBoolean((ValueType *)&local_1a.field_0);
        local_29 = true;
        if (!bVar1) {
          local_1c.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               GetValueType(this);
          bVar1 = ValueType::IsNull((ValueType *)&local_1c.field_0);
          local_29 = true;
          if (!bVar1) {
            local_1e.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 GetValueType(this);
            local_29 = ValueType::IsUndefined((ValueType *)&local_1e.field_0);
          }
        }
        this_local._7_1_ = (bool)((local_29 ^ 0xffU) & 1);
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Opnd::IsWriteBarrierTriggerableValue()
{
    // Determines whether if an operand is used as a source in a store instruction, whether the store needs a write barrier

    // If it's a tagged value, we don't need a write barrier
    if (this->IsTaggedValue())
    {
        return false;
    }

    if (TySize[this->GetType()] != sizeof(void*))
    {
        return false;
    }

#if DBG
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        return true; // No further optimization if we are in verification
    }
#endif

    // If this operand is known address, then it doesn't need a write barrier, the address is either not a GC address or is pinned
    if (this->IsAddrOpnd() && this->AsAddrOpnd()->GetAddrOpndKind() == AddrOpndKindDynamicVar)
    {
        return false;
    }

    // If its null/boolean/undefined, we don't need a write barrier since the javascript library will keep those guys alive
    return !(this->GetValueType().IsBoolean() || this->GetValueType().IsNull() || this->GetValueType().IsUndefined());
}